

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::internal::
MatcherBase<const_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_&>
::~MatcherBase(MatcherBase<const_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_&>
               *this)

{
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }